

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExplain::Deserialize(LogicalExplain *this,Deserializer *deserializer)

{
  ExplainType EVar1;
  int iVar2;
  uint uVar3;
  LogicalExplain *this_00;
  pointer pLVar4;
  pointer *__ptr;
  unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::LogicalExplain_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"explain_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    EVar1 = EnumUtil::FromString<duckdb::ExplainType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    EVar1 = (ExplainType)iVar2;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (LogicalExplain *)operator_new(200);
  LogicalOperator::LogicalOperator((LogicalOperator *)this_00,LOGICAL_EXPLAIN);
  (this_00->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalExplain_02488158;
  (this_00->super_LogicalOperator).field_0x61 = EVar1;
  (this_00->physical_plan)._M_dataplus._M_p = (pointer)&(this_00->physical_plan).field_2;
  (this_00->physical_plan)._M_string_length = 0;
  (this_00->physical_plan).field_2._M_local_buf[0] = '\0';
  (this_00->logical_plan_unopt)._M_dataplus._M_p = (pointer)&(this_00->logical_plan_unopt).field_2;
  (this_00->logical_plan_unopt)._M_string_length = 0;
  (this_00->logical_plan_unopt).field_2._M_local_buf[0] = '\0';
  (this_00->logical_plan_opt)._M_dataplus._M_p = (pointer)&(this_00->logical_plan_opt).field_2;
  (this_00->logical_plan_opt)._M_string_length = 0;
  (this_00->logical_plan_opt).field_2._M_local_buf[0] = '\0';
  local_58._M_head_impl = this_00;
  pLVar4 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"physical_plan");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar4->physical_plan,(string *)&local_50);
    if (local_50 != local_40) goto LAB_010ad3c7;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar4->physical_plan,(string *)&local_50);
    if (local_50 != local_40) {
LAB_010ad3c7:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"logical_plan_unopt");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar4->logical_plan_unopt,(string *)&local_50);
    if (local_50 != local_40) goto LAB_010ad466;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar4->logical_plan_unopt,(string *)&local_50);
    if (local_50 != local_40) {
LAB_010ad466:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"logical_plan_opt");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar4->logical_plan_opt,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010ad50a;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar4->logical_plan_opt,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010ad50a;
  }
  operator_delete(local_50);
LAB_010ad50a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExplain::Deserialize(Deserializer &deserializer) {
	auto explain_type = deserializer.ReadProperty<ExplainType>(200, "explain_type");
	auto result = duckdb::unique_ptr<LogicalExplain>(new LogicalExplain(explain_type));
	deserializer.ReadPropertyWithDefault<string>(201, "physical_plan", result->physical_plan);
	deserializer.ReadPropertyWithDefault<string>(202, "logical_plan_unopt", result->logical_plan_unopt);
	deserializer.ReadPropertyWithDefault<string>(203, "logical_plan_opt", result->logical_plan_opt);
	return std::move(result);
}